

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::
SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>,_false>
::grow(SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>,_false>
       *this,size_t MinSize)

{
  move_iterator<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>_*>
  __first;
  move_iterator<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>_*>
  __last;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
  *__result;
  ulong uVar1;
  undefined1 *puVar2;
  undefined1 *__ptr;
  
  __first._M_current =
       (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
        *)(this->
          super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>,_void>
          ).super_SmallVectorBase.BeginX;
  __last._M_current =
       (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
        *)(this->
          super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>,_void>
          ).super_SmallVectorBase.EndX;
  uVar1 = ((long)(this->
                 super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>,_void>
                 ).super_SmallVectorBase.CapacityX - (long)__first._M_current >> 3) *
          -0x7dc11f7047dc11f7 + 2;
  uVar1 = uVar1 >> 1 | uVar1;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 0x10 | uVar1;
  uVar1 = (uVar1 >> 0x20 | uVar1) + 1;
  if (uVar1 <= MinSize) {
    uVar1 = MinSize;
  }
  __result = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>
              *)malloc(uVar1 * 0x1c8);
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>>*>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<399u,Fixpp::Type::Int>,Fixpp::TagT<400u,Fixpp::Type::String>,Fixpp::TagT<401u,Fixpp::Type::Int>,Fixpp::TagT<404u,Fixpp::Type::Float>,Fixpp::TagT<441u,Fixpp::Type::Int>,Fixpp::TagT<402u,Fixpp::Type::Float>,Fixpp::TagT<403u,Fixpp::Type::Float>,Fixpp::TagT<405u,Fixpp::Type::Float>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<407u,Fixpp::Type::Float>,Fixpp::TagT<408u,Fixpp::Type::Float>>>*>
            (__first,__last,__result);
  __ptr = (undefined1 *)
          (this->
          super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>,_void>
          ).super_SmallVectorBase.BeginX;
  puVar2 = (undefined1 *)
           (this->
           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>,_void>
           ).super_SmallVectorBase.EndX;
  if (puVar2 != __ptr) {
    do {
      if (puVar2 + -0xf0 != *(undefined1 **)(puVar2 + -0x108)) {
        free(*(undefined1 **)(puVar2 + -0x108));
      }
      puVar2 = puVar2 + -0x1c8;
    } while (puVar2 != __ptr);
    __ptr = (undefined1 *)
            (this->
            super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>,_void>
            ).super_SmallVectorBase.BeginX;
  }
  if ((U *)__ptr !=
      &(this->
       super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>,_void>
       ).FirstEl) {
    free(__ptr);
  }
  (this->
  super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>,_void>
  ).super_SmallVectorBase.EndX =
       (void *)(((long)__last._M_current - (long)__first._M_current) + (long)__result);
  (this->
  super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>,_void>
  ).super_SmallVectorBase.BeginX = __result;
  (this->
  super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<398U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<399U,_Fixpp::Type::Int>,_Fixpp::TagT<400U,_Fixpp::Type::String>,_Fixpp::TagT<401U,_Fixpp::Type::Int>,_Fixpp::TagT<404U,_Fixpp::Type::Float>,_Fixpp::TagT<441U,_Fixpp::Type::Int>,_Fixpp::TagT<402U,_Fixpp::Type::Float>,_Fixpp::TagT<403U,_Fixpp::Type::Float>,_Fixpp::TagT<405U,_Fixpp::Type::Float>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<407U,_Fixpp::Type::Float>,_Fixpp::TagT<408U,_Fixpp::Type::Float>_>_>,_void>
  ).super_SmallVectorBase.CapacityX = __result + uVar1;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, isPodLike>::grow(size_t MinSize) {
  size_t CurCapacity = this->capacity();
  size_t CurSize = this->size();
  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(CurCapacity+2));
  if (NewCapacity < MinSize)
    NewCapacity = MinSize;
  T *NewElts = static_cast<T*>(malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->setEnd(NewElts+CurSize);
  this->BeginX = NewElts;
  this->CapacityX = this->begin()+NewCapacity;
}